

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

If_Grp_t *
If_CluFindGroup(If_Grp_t *__return_storage_ptr__,word *pF,int nVars,int iVarStart,int iVarStop,
               int *V2P,int *P2V,int nBSsize,int fDisjoint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int jVar;
  ulong uVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  int local_88;
  
  __return_storage_ptr__->nVars = '\0';
  __return_storage_ptr__->nMyu = '\0';
  __return_storage_ptr__->pVars[0] = '\0';
  __return_storage_ptr__->pVars[1] = '\0';
  __return_storage_ptr__->pVars[2] = '\0';
  __return_storage_ptr__->pVars[3] = '\0';
  __return_storage_ptr__->pVars[4] = '\0';
  __return_storage_ptr__->pVars[5] = '\0';
  __return_storage_ptr__->pVars[6] = '\0';
  __return_storage_ptr__->pVars[7] = '\0';
  __return_storage_ptr__->pVars[8] = '\0';
  __return_storage_ptr__->pVars[9] = '\0';
  __return_storage_ptr__->pVars[10] = '\0';
  __return_storage_ptr__->pVars[0xb] = '\0';
  __return_storage_ptr__->pVars[0xc] = '\0';
  __return_storage_ptr__->pVars[0xd] = '\0';
  __return_storage_ptr__->pVars[0xe] = '\0';
  __return_storage_ptr__->pVars[0xf] = '\0';
  iVar7 = nVars - nBSsize;
  if (((iVar7 == 0 || nVars < nBSsize) || (0x10 < nVars)) || (nVars < nBSsize + iVarStart)) {
    __assert_fail("nVars > nBSsize && nVars >= nBSsize + iVarStart && nVars <= CLU_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x520,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  if (4 < nBSsize - 2U) {
    __assert_fail("nBSsize >= 2 && nBSsize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x521,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  if (iVarStop != 0 && iVarStart != 0) {
    __assert_fail("!iVarStart || !iVarStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x522,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  __return_storage_ptr__->nVars = (char)nBSsize;
  iVar1 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
  __return_storage_ptr__->nMyu = (char)iVar1;
  if (0 < nBSsize) {
    uVar6 = 0;
    do {
      __return_storage_ptr__->pVars[uVar6] = (char)P2V[(long)iVar7 + uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)nBSsize != uVar6);
  }
  if (((char)iVar1 != '\x02') &&
     ((fDisjoint != 0 ||
      (iVar1 = If_CluCheckNonDisjointGroup(pF,nVars,V2P,P2V,__return_storage_ptr__), iVar1 == 0))))
  {
    if (nBSsize + iVarStart != nVars) {
      jVar = (nVars + -1) - nBSsize;
      iVar1 = nBSsize + 1;
      iVar2 = 0;
      do {
        if (nBSsize < nVars + -1) {
          local_88 = P2V[jVar];
          iVar3 = If_CluCountCofs(pF,nVars,iVar1,0,(word (*) [256])0x0);
          lVar8 = (long)(iVar7 + -2) + 1;
          if (iVarStart <= iVar7 + -2) {
            do {
              If_CluSwapVars(pF,nVars,V2P,P2V,V2P[P2V[lVar8 + -1]],jVar);
              iVar4 = If_CluCountCofs(pF,nVars,iVar1,0,(word (*) [256])0x0);
              if (iVar4 <= iVar3) {
                local_88 = P2V[jVar];
                iVar3 = iVar4;
              }
              lVar8 = lVar8 + -1;
            } while (iVarStart < lVar8);
          }
          If_CluSwapVars(pF,nVars,V2P,P2V,V2P[local_88],jVar);
          iVar4 = If_CluCountCofs(pF,nVars,iVar1,0,(word (*) [256])0x0);
          if (iVar4 != iVar3) {
            __assert_fail("nCofs == nCofsBest2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                          ,0x554,
                          "If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)")
            ;
          }
        }
        iVar3 = P2V[jVar];
        iVar4 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
        lVar8 = (long)iVar7;
        if (iVarStop < nBSsize) {
          do {
            If_CluSwapVars(pF,nVars,V2P,P2V,V2P[P2V[lVar8]],jVar);
            iVar5 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
            if (iVar5 <= iVar4) {
              iVar3 = P2V[jVar];
              iVar4 = iVar5;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < nVars - iVarStop);
        }
        If_CluSwapVars(pF,nVars,V2P,P2V,V2P[iVar3],jVar);
        iVar3 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
        if (iVar3 != iVar4) {
          __assert_fail("nCofs == nCofsBest2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x56b,
                        "If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
        }
        if (iVar3 <= __return_storage_ptr__->nMyu) {
          __return_storage_ptr__->nVars = (char)nBSsize;
          __return_storage_ptr__->nMyu = (char)iVar3;
          if (0 < nBSsize) {
            uVar6 = 0;
            do {
              __return_storage_ptr__->pVars[uVar6] = (char)P2V[(long)iVar7 + uVar6];
              uVar6 = uVar6 + 1;
            } while ((uint)nBSsize != uVar6);
          }
        }
        if (__return_storage_ptr__->nMyu == '\x02') {
          return __return_storage_ptr__;
        }
        if ((fDisjoint == 0) &&
           (iVar3 = If_CluCheckNonDisjointGroup(pF,nVars,V2P,P2V,__return_storage_ptr__), iVar3 != 0
           )) {
          return __return_storage_ptr__;
        }
        bVar9 = iVar2 == 0;
        iVar2 = iVar2 + 1;
      } while (bVar9);
    }
    __return_storage_ptr__->nVars = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluFindGroup( word * pF, int nVars, int iVarStart, int iVarStop, int * V2P, int * P2V, int nBSsize, int fDisjoint )
{
    int fVerbose = 0;
    int nRounds = 2;//nBSsize;
    If_Grp_t G = {0}, * g = &G;//, BestG = {0};
    int i, r, v, nCofs, VarBest, nCofsBest2;
    assert( nVars > nBSsize && nVars >= nBSsize + iVarStart && nVars <= CLU_VAR_MAX );
    assert( nBSsize >= 2 && nBSsize <= 6 );
    assert( !iVarStart || !iVarStop );
    // start with the default group
    g->nVars = nBSsize;
    g->nMyu = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
    for ( i = 0; i < nBSsize; i++ )
        g->pVars[i] = P2V[nVars-nBSsize+i];
    // check if good enough
    if ( g->nMyu == 2 )
        return G;
    if ( !fDisjoint && If_CluCheckNonDisjointGroup( pF, nVars, V2P, P2V, g ) )
    {
//        BestG = G;
        return G;
    }
    if ( nVars == nBSsize + iVarStart )
    {
        g->nVars = 0;
        return G;
    }

    if ( fVerbose )
    {
        printf( "Iter %2d  ", -1 );
        If_CluPrintGroup( g );
    }

    // try to find better group
    for ( r = 0; r < nRounds; r++ )
    {
        if ( nBSsize < nVars-1 )
        {
            // find the best var to add
            VarBest = P2V[nVars-1-nBSsize];
            nCofsBest2 = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
            for ( v = nVars-2-nBSsize; v >= iVarStart; v-- )
            {
//                If_CluMoveVar( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
                If_CluMoveVar2( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
                nCofs = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
                if ( nCofsBest2 >= nCofs )
                {
                    nCofsBest2 = nCofs;
                    VarBest = P2V[nVars-1-nBSsize];
                }
            }
            // go back
//            If_CluMoveVar( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
            If_CluMoveVar2( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
            // update best bound set
            nCofs = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
            assert( nCofs == nCofsBest2 );
        }

        // find the best var to remove
        VarBest = P2V[nVars-1-nBSsize];
        nCofsBest2 = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
        for ( v = nVars-nBSsize; v < nVars-iVarStop; v++ )
        {
//            If_CluMoveVar( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
            If_CluMoveVar2( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
            nCofs = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
            if ( nCofsBest2 >= nCofs )
            {
                nCofsBest2 = nCofs;
                VarBest = P2V[nVars-1-nBSsize];
            }
        }

        // go back
//        If_CluMoveVar( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
        If_CluMoveVar2( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
        // update best bound set
        nCofs = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
        assert( nCofs == nCofsBest2 );
        if ( g->nMyu >= nCofs )
        {
            g->nVars = nBSsize;
            g->nMyu = nCofs;
            for ( i = 0; i < nBSsize; i++ )
                g->pVars[i] = P2V[nVars-nBSsize+i];
        }

        if ( fVerbose )
        {
            printf( "Iter %2d  ", r );
            If_CluPrintGroup( g );
        }

        // check if good enough
        if ( g->nMyu == 2 )
            return G;
        if ( !fDisjoint && If_CluCheckNonDisjointGroup( pF, nVars, V2P, P2V, g ) )
        {
//            BestG = G;
            return G;
        }
    }

    assert( r == nRounds );
    g->nVars = 0;
    return G;
//    return BestG;
}